

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iothubtransport_amqp_messenger.c
# Opt level: O0

int amqp_messenger_start(AMQP_MESSENGER_HANDLE messenger_handle,SESSION_HANDLE session_handle)

{
  LOGGER_LOG p_Var1;
  LOGGER_LOG l_1;
  AMQP_MESSENGER_INSTANCE_conflict *instance;
  LOGGER_LOG l;
  int result;
  SESSION_HANDLE session_handle_local;
  AMQP_MESSENGER_HANDLE messenger_handle_local;
  
  if ((messenger_handle == (AMQP_MESSENGER_HANDLE)0x0) || (session_handle == (SESSION_HANDLE)0x0)) {
    p_Var1 = xlogging_get_log_function();
    if (p_Var1 != (LOGGER_LOG)0x0) {
      (*p_Var1)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_amqp_messenger.c"
                ,"amqp_messenger_start",0x4ad,1,"Invalid argument (session_handle is NULL)");
    }
    l._4_4_ = 0x4ae;
  }
  else if (messenger_handle->state == AMQP_MESSENGER_STATE_STOPPED) {
    messenger_handle->session_handle = session_handle;
    update_messenger_state(messenger_handle,AMQP_MESSENGER_STATE_STARTING);
    l._4_4_ = 0;
  }
  else {
    l._4_4_ = 0x4b6;
    p_Var1 = xlogging_get_log_function();
    if (p_Var1 != (LOGGER_LOG)0x0) {
      (*p_Var1)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_amqp_messenger.c"
                ,"amqp_messenger_start",0x4b7,1,
                "amqp_messenger_start failed (current state is %d; expected AMQP_MESSENGER_STATE_STOPPED)"
                ,messenger_handle->state);
    }
  }
  return l._4_4_;
}

Assistant:

int amqp_messenger_start(AMQP_MESSENGER_HANDLE messenger_handle, SESSION_HANDLE session_handle)
{
    int result;

    if (messenger_handle == NULL || session_handle == NULL)
    {
        LogError("Invalid argument (session_handle is NULL)");
        result = MU_FAILURE;
    }
    else
    {
        AMQP_MESSENGER_INSTANCE* instance = (AMQP_MESSENGER_INSTANCE*)messenger_handle;

        if (instance->state != AMQP_MESSENGER_STATE_STOPPED)
        {
            result = MU_FAILURE;
            LogError("amqp_messenger_start failed (current state is %d; expected AMQP_MESSENGER_STATE_STOPPED)", instance->state);
        }
        else
        {
            instance->session_handle = session_handle;

            update_messenger_state(instance, AMQP_MESSENGER_STATE_STARTING);

            result = RESULT_OK;
        }
    }

    return result;
}